

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_atkey_key(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int yythunkpos449;
  int yypos449;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_230b,"^>");
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar3 = yymatchClass(G,(uchar *)anon_var_dwarf_230b,"^>");
    } while (iVar3 != 0);
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_1_atkey_key,G->begin,G->end,"yy_1_atkey_key");
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_atkey_key(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "atkey_key"));
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l447;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\277\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^>")) goto l447;

  l448:;	
  {  int yypos449= G->pos, yythunkpos449= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\277\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^>")) goto l449;
  goto l448;
  l449:;	  G->pos= yypos449; G->thunkpos= yythunkpos449;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l447;  yyDo(G, yy_1_atkey_key, G->begin, G->end, "yy_1_atkey_key");
  yyprintf((stderr, "  ok   atkey_key"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l447:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "atkey_key"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}